

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CThreadSynchronizationInfo::InitializePreCreate(CThreadSynchronizationInfo *this)

{
  int iVar1;
  SHMPTR SVar2;
  uint *pt;
  int local_40;
  int local_3c;
  int local_2c;
  int iEagains;
  int MaxUnavailableResourceRetries;
  int iRet;
  DWORD *pdwWaitState;
  PAL_ERROR palErr;
  CThreadSynchronizationInfo *this_local;
  
  pdwWaitState._4_4_ = 0;
  SVar2 = SHMalloc(4);
  this->m_shridWaitAwakened = SVar2;
  if (this->m_shridWaitAwakened == 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    pdwWaitState._4_4_ = 8;
  }
  else {
    pt = (uint *)SHMPtrToPtr(this->m_shridWaitAwakened);
    if (pt == (uint *)0x0) {
      fprintf(_stderr,"] %s %s:%d","InitializePreCreate",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
              ,0xeee);
      fprintf(_stderr,
              "Expression: NULL != pdwWaitState, Description: Unable to map shared wait state: bad shrared id[shrid=%p]\n"
              ,this->m_shridWaitAwakened);
    }
    VolatileStore<unsigned_int>(pt,0);
    this->m_tsThreadState = TS_STARTING;
    local_2c = 0;
    while (iVar1 = pthread_mutex_init((pthread_mutex_t *)&this->m_tnwdNativeData,
                                      (pthread_mutexattr_t *)0x0), iVar1 != 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      strerror(iVar1);
      if ((iVar1 != 0xb) || (local_2c = local_2c + 1, 10 < local_2c)) {
        if (iVar1 == 0xc) {
          pdwWaitState._4_4_ = 8;
        }
        else {
          pdwWaitState._4_4_ = 0x54f;
        }
        goto LAB_003c47a3;
      }
      if (local_2c * 10 < 0x65) {
        local_3c = local_2c * 10;
      }
      else {
        local_3c = 100;
      }
      poll((pollfd *)0x0,0,local_3c);
    }
    local_2c = 0;
    while (iVar1 = pthread_cond_init((pthread_cond_t *)&(this->m_tnwdNativeData).cond,
                                     (pthread_condattr_t *)0x0), iVar1 != 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      strerror(iVar1);
      if ((iVar1 != 0xb) || (local_2c = local_2c + 1, 10 < local_2c)) {
        if (iVar1 == 0xc) {
          pdwWaitState._4_4_ = 8;
        }
        else {
          pdwWaitState._4_4_ = 0x54f;
        }
        pthread_mutex_destroy((pthread_mutex_t *)&this->m_tnwdNativeData);
        goto LAB_003c47a3;
      }
      if (local_2c * 10 < 0x65) {
        local_40 = local_2c * 10;
      }
      else {
        local_40 = 100;
      }
      poll((pollfd *)0x0,0,local_40);
    }
    (this->m_tnwdNativeData).fInitialized = true;
  }
LAB_003c47a3:
  if (pdwWaitState._4_4_ != 0) {
    this->m_tsThreadState = TS_FAILED;
  }
  return pdwWaitState._4_4_;
}

Assistant:

PAL_ERROR CThreadSynchronizationInfo::InitializePreCreate(void)
    {
        PAL_ERROR palErr = NO_ERROR;
        DWORD * pdwWaitState = NULL;
        int iRet;
#if !SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
        const int MaxUnavailableResourceRetries = 10;
        int iEagains;
#else // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
        int iPipes[2] = { -1, -1};
#endif // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING

        m_shridWaitAwakened = RawSharedObjectAlloc(sizeof(DWORD),
                                                   DefaultSharedPool);
        if (NULLSharedID == m_shridWaitAwakened)
        {
            ERROR("Fail allocating thread wait status shared object\n");
            palErr = ERROR_NOT_ENOUGH_MEMORY;
            goto IPrC_exit;
        }

        pdwWaitState = SharedIDToTypePointer(DWORD,
            m_shridWaitAwakened);

        _ASSERT_MSG(NULL != pdwWaitState,
                    "Unable to map shared wait state: bad shrared id"
                    "[shrid=%p]\n", (VOID*)m_shridWaitAwakened);

        VolatileStore<DWORD>(pdwWaitState, TWS_ACTIVE);
        m_tsThreadState = TS_STARTING;

#if !SYNCHMGR_PIPE_BASED_THREAD_BLOCKING

        iEagains = 0;
    Mutex_retry:
        iRet = pthread_mutex_init(&m_tnwdNativeData.mutex, NULL);
        if (0 != iRet)
        {
            ERROR("Failed creating thread synchronization mutex "
                  "[error=%d (%s)]\n", iRet, strerror(iRet));
            if (EAGAIN == iRet && MaxUnavailableResourceRetries >= ++iEagains)
            {
                poll(NULL, 0, min(100,10*iEagains));
                goto Mutex_retry;
            }
            else if (ENOMEM == iRet)
            {
                palErr = ERROR_NOT_ENOUGH_MEMORY;
            }
            else
            {
                palErr = ERROR_INTERNAL_ERROR;
            }
            goto IPrC_exit;
        }

        iEagains = 0;
    Cond_retry:
        iRet = pthread_cond_init(&m_tnwdNativeData.cond, NULL);
        if (0 != iRet)
        {
            ERROR("Failed creating thread synchronization condition "
                  "[error=%d (%s)]\n", iRet, strerror(iRet));
            if (EAGAIN == iRet && MaxUnavailableResourceRetries >= ++iEagains)
            {
                poll(NULL, 0, min(100,10*iEagains));
                goto Cond_retry;
            }
            else if (ENOMEM == iRet)
            {
                palErr = ERROR_NOT_ENOUGH_MEMORY;
            }
            else
            {
                palErr = ERROR_INTERNAL_ERROR;
            }
            pthread_mutex_destroy(&m_tnwdNativeData.mutex);
            goto IPrC_exit;
        }

#else // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING

        iRet = pipe(iPipes);
        if (0 != iRet)
        {
            ERROR("Failed to create pipes to support native wait [errno=%d (%s)]\n",
                  errno, strerror(errno));
            switch(errno)
            {
                case EMFILE:
                case ENFILE:
                    palErr = ERROR_NO_SYSTEM_RESOURCES;
                    break;
                case EFAULT:
                    palErr = ERROR_INVALID_DATA;
                    break;
                default:
                    palErr = ERROR_INTERNAL_ERROR;
                    break;
            }

            goto IPrC_exit;
        }

        if (0 != fcntl(iPipes[0], F_SETFL, O_NONBLOCK) ||
            0 != fcntl(iPipes[1], F_SETFL, O_NONBLOCK))
        {
            ERROR("Failed to set thread-blocking pipes to non-blocking mode "
                  "[errno=%d (%s)]\n", errno, strerror(errno));
            close(iPipes[0]);
            close(iPipes[1]);
            palErr = ERROR_INTERNAL_ERROR;
            goto IPrC_exit;
        }

        m_tnwdNativeData.iPipeRd = iPipes[0];
        m_tnwdNativeData.iPipeWr = iPipes[1];

#endif // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING

        m_tnwdNativeData.fInitialized = true;

    IPrC_exit:
        if (NO_ERROR != palErr)
        {
            m_tsThreadState = TS_FAILED;
        }
        return palErr;
    }